

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBSetRow_X86(uint8_t *dst_argb,uint32_t v32,int width)

{
  long lVar1;
  size_t width_tmp;
  int width_local;
  uint32_t v32_local;
  uint8_t *dst_argb_local;
  
  for (lVar1 = (long)width; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(uint32_t *)dst_argb = v32;
    dst_argb = (uint8_t *)((long)dst_argb + 4);
  }
  return;
}

Assistant:

void ARGBSetRow_X86(uint8_t* dst_argb, uint32_t v32, int width) {
  size_t width_tmp = (size_t)(width);
  asm volatile(

      "rep         stosl                         \n"
      : "+D"(dst_argb),  // %0
        "+c"(width_tmp)  // %1
      : "a"(v32)         // %2
      : "memory", "cc");
}